

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O0

void __thiscall
OpenMD::DynamicRectMatrix<double>::allocate(DynamicRectMatrix<double> *this,uint nrow,uint ncol)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  uint i;
  uint local_14;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  uVar2 = SUB168(ZEXT416(*(uint *)(in_RDI + 1)) * ZEXT816(8),0);
  if (SUB168(ZEXT416(*(uint *)(in_RDI + 1)) * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *in_RDI = (long)pvVar3;
  for (local_14 = 0; local_14 < *(uint *)(in_RDI + 1); local_14 = local_14 + 1) {
    auVar1 = ZEXT416(*(uint *)((long)in_RDI + 0xc)) * ZEXT816(8);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    *(void **)(*in_RDI + (ulong)local_14 * 8) = pvVar3;
  }
  return;
}

Assistant:

void allocate(unsigned int nrow, unsigned int ncol) {
      nrow_ = (unsigned int)nrow;
      ncol_ = (unsigned int)ncol;
      data_ = new Real*[nrow_];
      for (unsigned int i = 0; i < nrow_; ++i)
        data_[i] = new Real[ncol_];
    }